

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.cpp
# Opt level: O2

uint8_t ixy::read_io8(istream *s,size_t offset)

{
  size_t sVar1;
  uint8_t tmp;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_20;
  
  std::istream::seekg(s,offset,0);
  sVar1 = std::istream::tellg();
  if (sVar1 == offset) {
    std::istream::read((char *)s,(long)&tmp);
    if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) != 0) {
      local_20.list.second = "failed to read IO resource";
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp"
                 ,0x5f,"read_io8",&local_20);
    }
    return tmp;
  }
  __assert_fail("(size_t) s.tellg() == offset",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp",
                0x5c,"uint8_t ixy::read_io8(std::istream &, size_t)");
}

Assistant:

auto read_io8(std::istream &s, size_t offset) -> uint8_t {
    uint8_t tmp;
    s.seekg(offset);
    assert((size_t) s.tellg() == offset);
    s.read(reinterpret_cast<char *>(&tmp), sizeof(tmp));
    if (!s) {
        error("failed to read IO resource");
    }
    return tmp;
}